

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeLower
          (SPxSolverBase<double> *this,int i,double *newLower,bool scale)

{
  byte bVar1;
  SPxStatus SVar2;
  double *pdVar3;
  byte in_CL;
  double *in_RDX;
  uint in_ESI;
  SPxSolverBase<double> *in_RDI;
  SPxLPBase<double> *this_00;
  double oldLower;
  int in_stack_ffffffffffffffbc;
  SPxLPBase<double> *in_stack_ffffffffffffffc0;
  double dVar4;
  undefined7 in_stack_ffffffffffffffe0;
  int i_00;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = in_CL & 1;
  dVar4 = *in_RDX;
  if (bVar1 == 0) {
    pdVar3 = SPxLPBase<double>::lower(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    i_00 = (int)((ulong)in_RDX >> 0x20);
    this_00 = (SPxLPBase<double> *)*pdVar3;
  }
  else {
    this_00 = (SPxLPBase<double> *)
              SPxLPBase<double>::lowerUnscaled
                        (&in_RDI->super_SPxLPBase<double>,
                         (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    i_00 = (int)((ulong)in_RDX >> 0x20);
  }
  if ((dVar4 != (double)this_00) || (NAN(dVar4) || NAN((double)this_00))) {
    forceRecompNonbasicValue(in_RDI);
    pdVar3 = SPxLPBase<double>::lower(this_00,in_stack_ffffffffffffffbc);
    dVar4 = *pdVar3;
    SPxLPBase<double>::changeLower
              ((SPxLPBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),i_00,
               (double *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),SUB81((ulong)dVar4 >> 0x38,0));
    SVar2 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
    if (NO_PROBLEM < SVar2) {
      pdVar3 = SPxLPBase<double>::lower(this_00,in_ESI);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x69])
                (*pdVar3,dVar4,in_RDI,(ulong)in_ESI);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLower(int i, const R& newLower, bool scale)
{
   if(newLower != (scale ? this->lowerUnscaled(i) : this->lower(i)))
   {
      forceRecompNonbasicValue();

      R oldLower = this->lower(i);
      // This has to be done before calling changeLowerStatus() because that is calling
      // basis.dualColStatus() which calls lower() and needs the changed value.
      SPxLPBase<R>::changeLower(i, newLower, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeLowerStatus(i, this->lower(i), oldLower);
         unInit();
      }
   }
}